

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockencodings_tests.cpp
# Opt level: O3

void __thiscall
blockencodings_tests::EmptyBlockRoundTripTest::test_method(EmptyBlockRoundTripTest *this)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  uint256 hash;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  uint32_t nBits;
  bool bVar3;
  ReadStatus RVar4;
  int iVar5;
  CChainParams *params;
  uint64_t nonce;
  vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_> *args_3;
  iterator pvVar6;
  iterator in_R9;
  iterator pvVar7;
  long in_FS_OFFSET;
  readonly_property<bool> rVar8;
  Span<std::byte> output;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  undefined4 uVar9;
  undefined4 uVar10;
  check_type cVar11;
  char *local_638;
  char *local_630;
  undefined1 *local_628;
  undefined1 *local_620;
  char *local_618;
  char *local_610;
  undefined1 *local_608;
  undefined1 *local_600;
  char *local_5f8;
  char *local_5f0;
  undefined1 local_5e8 [16];
  undefined1 *local_5d8;
  char *local_5d0;
  undefined1 *local_5c8;
  undefined1 *local_5c0;
  char *local_5b8;
  char *local_5b0;
  char *local_5a8;
  char *local_5a0;
  undefined1 *local_598;
  undefined1 *local_590;
  char *local_588;
  char *local_580;
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  vtx_missing;
  char *local_558;
  char *local_550;
  undefined1 *local_548;
  undefined1 *local_540;
  char *local_538;
  char *local_530;
  char *local_528;
  char *local_520;
  undefined1 *local_518;
  undefined1 *local_510;
  char *local_508;
  char *local_500;
  DataStream local_4f8;
  bool mutated;
  CMutableTransaction coinbase;
  string *local_490;
  string *local_488;
  char *local_480;
  assertion_result local_478;
  string *local_460;
  assertion_result local_458;
  string **local_440;
  assertion_result local_438;
  lazy_ostream *local_420;
  undefined1 local_418 [16];
  shared_count asStack_408 [2];
  string local_3f8;
  string local_3d8;
  string local_3b8;
  undefined1 local_398 [16];
  undefined8 local_388;
  undefined ***pppuStack_380;
  undefined8 local_378;
  uchar auStack_370 [40];
  undefined1 local_348 [32];
  uint256 ret;
  _Any_data local_2a0;
  _Manager_type local_290;
  _Invoker_type p_Stack_288;
  CBlockHeaderAndShortTxIDs shortIDs2;
  CBlockHeaderAndShortTxIDs shortIDs;
  uint256 local_150;
  FastRandomContext rand_ctx;
  CBlock local_a8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  inline_assertion_check<true,std::unique_ptr<CTxMemPool,std::default_delete<CTxMemPool>>&>
            (&(this->super_BOOST_AUTO_TEST_CASE_FIXTURE).super_TestingSetup.super_ChainTestingSetup.
              super_BasicTestingSetup.m_node.mempool,
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
             ,0x10f,"test_method","m_node.mempool");
  BuildTransactionTestCase();
  local_a8.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_3_ = 0;
  local_a8._99_8_ = 0;
  local_a8.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_3_ = 0;
  local_a8.vtx.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._3_5_ = 0;
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_a8.super_CBlockHeader.nTime = 0;
  local_a8.super_CBlockHeader.nBits = 0;
  local_a8.super_CBlockHeader.nNonce = 0;
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  local_a8.super_CBlockHeader.nVersion = 0;
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0] = '*';
  FastRandomContext::FastRandomContext(&rand_ctx,&ret);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::resize(&local_a8.vtx,1);
  ret.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<CTransaction_const,std::allocator<CTransaction>,CMutableTransaction>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             (ret.super_base_blob<256U>.m_data._M_elems + 8),(CTransaction **)&ret,
             (allocator<CTransaction> *)&shortIDs,&coinbase);
  peVar1 = (element_type *)
           CONCAT71(ret.super_base_blob<256U>.m_data._M_elems._1_7_,
                    ret.super_base_blob<256U>.m_data._M_elems[0]);
  p_Var2 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           CONCAT71(ret.super_base_blob<256U>.m_data._M_elems._9_7_,
                    ret.super_base_blob<256U>.m_data._M_elems[8]);
  ret.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  this_00 = ((local_a8.vtx.
              super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  ((local_a8.vtx.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->
  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = peVar1;
  ((local_a8.vtx.
    super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ._M_impl.super__Vector_impl_data._M_start)->
  super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi = p_Var2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      CONCAT71(ret.super_base_blob<256U>.m_data._M_elems._9_7_,
               ret.super_base_blob<256U>.m_data._M_elems[8]) !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               CONCAT71(ret.super_base_blob<256U>.m_data._M_elems._9_7_,
                        ret.super_base_blob<256U>.m_data._M_elems[8]));
  }
  local_a8.super_CBlockHeader.nVersion = 0x2a;
  ret.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  output.m_size = 0x20;
  output.m_data = (byte *)&ret;
  FastRandomContext::fillrand(&rand_ctx,output);
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._16_4_ =
       SUB84(CONCAT71(ret.super_base_blob<256U>.m_data._M_elems._17_7_,
                      ret.super_base_blob<256U>.m_data._M_elems[0x10]),0);
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._20_4_ =
       ret.super_base_blob<256U>.m_data._M_elems._20_4_;
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._24_4_ =
       ret.super_base_blob<256U>.m_data._M_elems._24_4_;
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._28_4_ =
       ret.super_base_blob<256U>.m_data._M_elems._28_4_;
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._0_4_ =
       SUB84(CONCAT71(ret.super_base_blob<256U>.m_data._M_elems._1_7_,
                      ret.super_base_blob<256U>.m_data._M_elems[0]),0);
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._4_4_ =
       ret.super_base_blob<256U>.m_data._M_elems._4_4_;
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._8_4_ =
       SUB84(CONCAT71(ret.super_base_blob<256U>.m_data._M_elems._9_7_,
                      ret.super_base_blob<256U>.m_data._M_elems[8]),0);
  local_a8.super_CBlockHeader.hashPrevBlock.super_base_blob<256U>.m_data._M_elems._12_4_ =
       ret.super_base_blob<256U>.m_data._M_elems._12_4_;
  local_a8.super_CBlockHeader.nBits = 0x207fffff;
  BlockMerkleRoot(&ret,&local_a8,&mutated);
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._16_4_ =
       SUB84(CONCAT71(ret.super_base_blob<256U>.m_data._M_elems._17_7_,
                      ret.super_base_blob<256U>.m_data._M_elems[0x10]),0);
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._20_4_ =
       ret.super_base_blob<256U>.m_data._M_elems._20_4_;
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._24_4_ =
       ret.super_base_blob<256U>.m_data._M_elems._24_4_;
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._28_4_ =
       ret.super_base_blob<256U>.m_data._M_elems._28_4_;
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._0_4_ =
       SUB84(CONCAT71(ret.super_base_blob<256U>.m_data._M_elems._1_7_,
                      ret.super_base_blob<256U>.m_data._M_elems[0]),0);
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._4_4_ =
       ret.super_base_blob<256U>.m_data._M_elems._4_4_;
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._8_4_ =
       SUB84(CONCAT71(ret.super_base_blob<256U>.m_data._M_elems._9_7_,
                      ret.super_base_blob<256U>.m_data._M_elems[8]),0);
  local_a8.super_CBlockHeader.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems._12_4_ =
       ret.super_base_blob<256U>.m_data._M_elems._12_4_;
  if (mutated != false) {
    __assert_fail("!mutated",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
                  ,0x11c,"void blockencodings_tests::EmptyBlockRoundTripTest::test_method()");
  }
  while( true ) {
    CBlockHeader::GetHash(&local_150,&local_a8.super_CBlockHeader);
    nBits = local_a8.super_CBlockHeader.nBits;
    params = Params();
    uVar9 = local_150.super_base_blob<256U>.m_data._M_elems._16_4_;
    uVar10 = local_150.super_base_blob<256U>.m_data._M_elems._20_4_;
    hash.super_base_blob<256U>.m_data._M_elems[8] =
         local_150.super_base_blob<256U>.m_data._M_elems[8];
    hash.super_base_blob<256U>.m_data._M_elems[9] =
         local_150.super_base_blob<256U>.m_data._M_elems[9];
    hash.super_base_blob<256U>.m_data._M_elems[10] =
         local_150.super_base_blob<256U>.m_data._M_elems[10];
    hash.super_base_blob<256U>.m_data._M_elems[0xb] =
         local_150.super_base_blob<256U>.m_data._M_elems[0xb];
    hash.super_base_blob<256U>.m_data._M_elems[0xc] =
         local_150.super_base_blob<256U>.m_data._M_elems[0xc];
    hash.super_base_blob<256U>.m_data._M_elems[0xd] =
         local_150.super_base_blob<256U>.m_data._M_elems[0xd];
    hash.super_base_blob<256U>.m_data._M_elems[0xe] =
         local_150.super_base_blob<256U>.m_data._M_elems[0xe];
    hash.super_base_blob<256U>.m_data._M_elems[0xf] =
         local_150.super_base_blob<256U>.m_data._M_elems[0xf];
    hash.super_base_blob<256U>.m_data._M_elems[0] =
         local_150.super_base_blob<256U>.m_data._M_elems[0];
    hash.super_base_blob<256U>.m_data._M_elems[1] =
         local_150.super_base_blob<256U>.m_data._M_elems[1];
    hash.super_base_blob<256U>.m_data._M_elems[2] =
         local_150.super_base_blob<256U>.m_data._M_elems[2];
    hash.super_base_blob<256U>.m_data._M_elems[3] =
         local_150.super_base_blob<256U>.m_data._M_elems[3];
    hash.super_base_blob<256U>.m_data._M_elems[4] =
         local_150.super_base_blob<256U>.m_data._M_elems[4];
    hash.super_base_blob<256U>.m_data._M_elems[5] =
         local_150.super_base_blob<256U>.m_data._M_elems[5];
    hash.super_base_blob<256U>.m_data._M_elems[6] =
         local_150.super_base_blob<256U>.m_data._M_elems[6];
    hash.super_base_blob<256U>.m_data._M_elems[7] =
         local_150.super_base_blob<256U>.m_data._M_elems[7];
    hash.super_base_blob<256U>.m_data._M_elems[0x10] = (char)uVar9;
    hash.super_base_blob<256U>.m_data._M_elems[0x11] = (char)((uint)uVar9 >> 8);
    hash.super_base_blob<256U>.m_data._M_elems[0x12] = (char)((uint)uVar9 >> 0x10);
    hash.super_base_blob<256U>.m_data._M_elems[0x13] = (char)((uint)uVar9 >> 0x18);
    hash.super_base_blob<256U>.m_data._M_elems[0x14] = (char)uVar10;
    hash.super_base_blob<256U>.m_data._M_elems[0x15] = (char)((uint)uVar10 >> 8);
    hash.super_base_blob<256U>.m_data._M_elems[0x16] = (char)((uint)uVar10 >> 0x10);
    hash.super_base_blob<256U>.m_data._M_elems[0x17] = (char)((uint)uVar10 >> 0x18);
    hash.super_base_blob<256U>.m_data._M_elems[0x18] =
         local_150.super_base_blob<256U>.m_data._M_elems[0x18];
    hash.super_base_blob<256U>.m_data._M_elems[0x19] =
         local_150.super_base_blob<256U>.m_data._M_elems[0x19];
    hash.super_base_blob<256U>.m_data._M_elems[0x1a] =
         local_150.super_base_blob<256U>.m_data._M_elems[0x1a];
    hash.super_base_blob<256U>.m_data._M_elems[0x1b] =
         local_150.super_base_blob<256U>.m_data._M_elems[0x1b];
    hash.super_base_blob<256U>.m_data._M_elems[0x1c] =
         local_150.super_base_blob<256U>.m_data._M_elems[0x1c];
    hash.super_base_blob<256U>.m_data._M_elems[0x1d] =
         local_150.super_base_blob<256U>.m_data._M_elems[0x1d];
    hash.super_base_blob<256U>.m_data._M_elems[0x1e] =
         local_150.super_base_blob<256U>.m_data._M_elems[0x1e];
    hash.super_base_blob<256U>.m_data._M_elems[0x1f] =
         local_150.super_base_blob<256U>.m_data._M_elems[0x1f];
    bVar3 = CheckProofOfWork(hash,nBits,&params->consensus);
    if (bVar3) break;
    local_a8.super_CBlockHeader.nNonce = local_a8.super_CBlockHeader.nNonce + 1;
  }
  nonce = FastRandomContext::rand64(&rand_ctx);
  CBlockHeaderAndShortTxIDs::CBlockHeaderAndShortTxIDs(&shortIDs,&local_a8,nonce);
  local_4f8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_4f8.m_read_pos = 0;
  local_4f8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_4f8.vch.super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  ret.super_base_blob<256U>.m_data._M_elems[0] = (uchar)&shortIDs.shorttxids;
  ret.super_base_blob<256U>.m_data._M_elems._1_7_ = SUB87((ulong)&shortIDs.shorttxids >> 8,0);
  args_3 = &shortIDs.prefilledtxn;
  SerializeMany<DataStream,CBlockHeader,unsigned_long,Wrapper<VectorFormatter<CustomUintFormatter<6,false>>,std::vector<unsigned_long,std::allocator<unsigned_long>>const&>,std::vector<PrefilledTransaction,std::allocator<PrefilledTransaction>>>
            (&local_4f8,&shortIDs.header,&shortIDs.nonce,
             (Wrapper<VectorFormatter<CustomUintFormatter<6,_false>_>,_const_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_&>
              *)&ret,args_3);
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  shortIDs2.header.nTime = 0;
  shortIDs2.header.nBits = 0;
  shortIDs2.header.nNonce = 0;
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  shortIDs2.header.hashMerkleRoot.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  shortIDs2.header.nVersion = 0;
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  shortIDs2.header.hashPrevBlock.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  shortIDs2.prefilledtxn.
  super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  shortIDs2.prefilledtxn.
  super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shortIDs2.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  shortIDs2.prefilledtxn.
  super__Vector_base<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shortIDs2.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  shortIDs2.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  CBlockHeaderAndShortTxIDs::
  SerializationOps<DataStream,CBlockHeaderAndShortTxIDs,ActionUnserialize>(&shortIDs2,&local_4f8);
  ret.super_base_blob<256U>.m_data._M_elems[0x10] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x11] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x12] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x13] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x14] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x15] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x16] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x17] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x18] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x19] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1a] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1b] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1c] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1d] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1e] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0x1f] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[1] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[2] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[3] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[4] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[5] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[6] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[7] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[8] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[9] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[10] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xb] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xc] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xd] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xe] = '\0';
  ret.super_base_blob<256U>.m_data._M_elems[0xf] = '\0';
  local_2a0._M_unused._M_object = (void *)0x0;
  local_2a0._8_8_ = 0;
  local_290 = (_Manager_type)0x0;
  p_Stack_288 = (_Invoker_type)0x0;
  local_508 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_500 = "";
  local_518 = &boost::unit_test::basic_cstring<char_const>::null;
  local_510 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x12a;
  file.m_begin = (iterator)&local_508;
  msg.m_end = in_R9;
  msg.m_begin = (iterator)args_3;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_518,msg);
  _cVar11 = 0x2d3e1e;
  RVar4 = PartiallyDownloadedBlock::InitData
                    ((PartiallyDownloadedBlock *)&ret,&shortIDs2,&empty_extra_txn);
  local_438.m_message.px = (element_type *)0x0;
  local_438.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_458._0_8_ = "partialBlock.InitData(shortIDs2, empty_extra_txn) == READ_STATUS_OK";
  local_458.m_message.px = (element_type *)0xe69640;
  local_398._8_8_ = local_398._8_8_ & 0xffffffffffffff00;
  local_398._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_388 = boost::unit_test::lazy_ostream::inst;
  local_528 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_520 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  pppuStack_380 = (undefined ***)&local_458;
  local_438.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(RVar4 == READ_STATUS_OK);
  boost::test_tools::tt_detail::report_assertion
            (&local_438,(lazy_ostream *)local_398,1,0,WARN,_cVar11,(size_t)&local_528,0x12a);
  boost::detail::shared_count::~shared_count(&local_438.m_message.pn);
  local_538 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_530 = "";
  local_548 = &boost::unit_test::basic_cstring<char_const>::null;
  local_540 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x12b;
  file_00.m_begin = (iterator)&local_538;
  msg_00.m_end = pvVar7;
  msg_00.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_548,
             msg_00);
  _cVar11 = 0x2d3eed;
  local_438.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       PartiallyDownloadedBlock::IsTxAvailable((PartiallyDownloadedBlock *)&ret,0);
  local_438.m_message.px = (element_type *)0x0;
  local_438.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_458._0_8_ = "partialBlock.IsTxAvailable(0)";
  local_458.m_message.px = (element_type *)0xe69828;
  local_398._8_8_ = local_398._8_8_ & 0xffffffffffffff00;
  local_398._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_388 = boost::unit_test::lazy_ostream::inst;
  local_558 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_550 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  pppuStack_380 = (undefined ***)&local_458;
  boost::test_tools::tt_detail::report_assertion
            (&local_438,(lazy_ostream *)local_398,1,0,WARN,_cVar11,(size_t)&local_558,299);
  boost::detail::shared_count::~shared_count(&local_438.m_message.pn);
  local_348._16_3_ = 0;
  local_348._19_8_ = 0;
  local_348._0_8_ = (pointer)0x0;
  local_348._8_3_ = 0;
  local_348._11_5_ = 0;
  auStack_370._24_8_ = 0;
  auStack_370._32_8_ = 0;
  auStack_370[8] = '\0';
  auStack_370[9] = '\0';
  auStack_370[10] = '\0';
  auStack_370[0xb] = '\0';
  auStack_370[0xc] = '\0';
  auStack_370[0xd] = '\0';
  auStack_370[0xe] = '\0';
  auStack_370[0xf] = '\0';
  auStack_370[0x10] = '\0';
  auStack_370[0x11] = '\0';
  auStack_370[0x12] = '\0';
  auStack_370[0x13] = '\0';
  auStack_370[0x14] = '\0';
  auStack_370[0x15] = '\0';
  auStack_370[0x16] = '\0';
  auStack_370[0x17] = '\0';
  local_378._0_1_ = '\0';
  local_378._1_1_ = '\0';
  local_378._2_1_ = '\0';
  local_378._3_1_ = '\0';
  local_378._4_1_ = '\0';
  local_378._5_1_ = '\0';
  local_378._6_1_ = '\0';
  local_378._7_1_ = '\0';
  auStack_370[0] = '\0';
  auStack_370[1] = '\0';
  auStack_370[2] = '\0';
  auStack_370[3] = '\0';
  auStack_370[4] = '\0';
  auStack_370[5] = '\0';
  auStack_370[6] = '\0';
  auStack_370[7] = '\0';
  local_388._0_1_ = '\0';
  local_388._1_1_ = '\0';
  local_388._2_1_ = '\0';
  local_388._3_1_ = '\0';
  local_388._4_1_ = '\0';
  local_388._5_1_ = '\0';
  local_388._6_1_ = '\0';
  local_388._7_1_ = '\0';
  pppuStack_380 = (undefined ***)0x0;
  local_398._0_8_ = (_func_int **)0x0;
  local_398[8] = '\0';
  local_398[9] = '\0';
  local_398[10] = '\0';
  local_398[0xb] = '\0';
  local_398[0xc] = '\0';
  local_398[0xd] = '\0';
  local_398[0xe] = '\0';
  local_398[0xf] = '\0';
  vtx_missing.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vtx_missing.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vtx_missing.
  super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_588 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_580 = "";
  local_598 = &boost::unit_test::basic_cstring<char_const>::null;
  local_590 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x12f;
  file_01.m_begin = (iterator)&local_588;
  msg_01.m_end = pvVar7;
  msg_01.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_598,
             msg_01);
  _cVar11 = 0x2d3ffb;
  RVar4 = PartiallyDownloadedBlock::FillBlock
                    ((PartiallyDownloadedBlock *)&ret,(CBlock *)local_398,&vtx_missing);
  local_458.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)(RVar4 == READ_STATUS_OK);
  local_458.m_message.px = (element_type *)0x0;
  local_458.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_420 = (lazy_ostream *)local_5e8;
  local_5e8._0_8_ = "partialBlock.FillBlock(block2, vtx_missing) == READ_STATUS_OK";
  local_5e8._8_8_ = "";
  local_438.m_message.px = (element_type *)((ulong)local_438.m_message.px & 0xffffffffffffff00);
  local_438._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_438.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_5a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_5a0 = "";
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_458,(lazy_ostream *)&local_438,1,0,WARN,_cVar11,(size_t)&local_5a8,0x12f);
  boost::detail::shared_count::~shared_count(&local_458.m_message.pn);
  local_5b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_5b0 = "";
  local_5c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_5c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0x130;
  file_02.m_begin = (iterator)&local_5b8;
  msg_02.m_end = pvVar7;
  msg_02.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_5c8,
             msg_02);
  local_5e8._8_8_ = local_5e8._8_8_ & 0xffffffffffffff00;
  local_5e8._0_8_ = &PTR__lazy_ostream_013ae088;
  local_5d8 = boost::unit_test::lazy_ostream::inst;
  local_5d0 = "";
  CBlockHeader::GetHash((uint256 *)&local_3d8,&local_a8.super_CBlockHeader);
  base_blob<256u>::ToString_abi_cxx11_(&local_3b8,&local_3d8);
  CBlockHeader::GetHash((uint256 *)local_418,(CBlockHeader *)local_398);
  base_blob<256u>::ToString_abi_cxx11_(&local_3f8,local_418);
  if (local_3b8._M_string_length == local_3f8._M_string_length) {
    if (local_3b8._M_string_length == 0) {
      rVar8.super_class_property<bool>.value = (class_property<bool>)true;
    }
    else {
      iVar5 = bcmp(local_3b8._M_dataplus._M_p,local_3f8._M_dataplus._M_p,local_3b8._M_string_length)
      ;
      rVar8.super_class_property<bool>.value = (class_property<bool>)(iVar5 == 0);
    }
  }
  else {
    rVar8.super_class_property<bool>.value = (class_property<bool>)false;
  }
  local_478.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)rVar8.super_class_property<bool>.value;
  local_478.m_message.px = (element_type *)0x0;
  local_478.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_488 = (string *)0xe69524;
  local_480 = "";
  local_420 = (lazy_ostream *)&local_460;
  local_438.m_message.px = (element_type *)((ulong)local_438.m_message.px & 0xffffffffffffff00);
  local_438._0_8_ = &PTR__lazy_ostream_013ae148;
  local_438.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_440 = &local_490;
  local_458.m_message.px = (element_type *)((ulong)local_458.m_message.px & 0xffffffffffffff00);
  local_458._0_8_ = &PTR__lazy_ostream_013ae148;
  local_458.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_490 = &local_3f8;
  local_460 = &local_3b8;
  boost::test_tools::tt_detail::report_assertion
            (&local_478,(lazy_ostream *)local_5e8,1,2,REQUIRE,0xe69761,(size_t)&local_488,0x130,
             &local_438,"block2.GetHash().ToString()",(int)&local_458);
  boost::detail::shared_count::~shared_count(&local_478.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
    operator_delete(local_3f8._M_dataplus._M_p,local_3f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
  }
  local_5f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_5f0 = "";
  local_608 = &boost::unit_test::basic_cstring<char_const>::null;
  local_600 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0x131;
  file_03.m_begin = (iterator)&local_5f8;
  msg_03.m_end = pvVar7;
  msg_03.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_608,
             msg_03);
  local_5e8._8_8_ = local_5e8._8_8_ & 0xffffffffffffff00;
  local_5e8._0_8_ = &PTR__lazy_ostream_013ae088;
  local_5d8 = boost::unit_test::lazy_ostream::inst;
  local_5d0 = "";
  base_blob<256u>::ToString_abi_cxx11_(&local_3b8,&local_a8.super_CBlockHeader.hashMerkleRoot);
  BlockMerkleRoot((uint256 *)&local_3f8,(CBlock *)local_398,&mutated);
  base_blob<256u>::ToString_abi_cxx11_(&local_3d8,&local_3f8);
  if (local_3b8._M_string_length == local_3d8._M_string_length) {
    if (local_3b8._M_string_length == 0) {
      local_418[0] = (class_property<bool>)true;
    }
    else {
      iVar5 = bcmp(local_3b8._M_dataplus._M_p,local_3d8._M_dataplus._M_p,local_3b8._M_string_length)
      ;
      local_418[0] = (class_property<bool>)(iVar5 == 0);
    }
  }
  else {
    local_418[0] = (class_property<bool>)false;
  }
  local_418._8_8_ = (element_type *)0x0;
  asStack_408[0].pi_ = (sp_counted_base *)0x0;
  local_478._0_8_ =
       "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_478.m_message.px = (element_type *)0xe6958a;
  local_438.m_message.px = (element_type *)((ulong)local_438.m_message.px & 0xffffffffffffff00);
  local_438._0_8_ = &PTR__lazy_ostream_013ae148;
  local_438.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_458.m_message.px = (element_type *)((ulong)local_458.m_message.px & 0xffffffffffffff00);
  local_458._0_8_ = &PTR__lazy_ostream_013ae148;
  local_458.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_440 = &local_460;
  pvVar6 = (iterator)0x1;
  pvVar7 = (iterator)0x2;
  local_488 = &local_3b8;
  local_460 = &local_3d8;
  local_420 = (lazy_ostream *)&local_488;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)local_418,(lazy_ostream *)local_5e8,1,2,REQUIRE,0xe69798,
             (size_t)&local_478,0x131,&local_438,"BlockMerkleRoot(block2, &mutated).ToString()",
             (int)&local_458);
  boost::detail::shared_count::~shared_count(asStack_408);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3d8._M_dataplus._M_p != &local_3d8.field_2) {
    operator_delete(local_3d8._M_dataplus._M_p,local_3d8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_3b8._M_dataplus._M_p != &local_3b8.field_2) {
    operator_delete(local_3b8._M_dataplus._M_p,local_3b8.field_2._M_allocated_capacity + 1);
  }
  local_618 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_610 = "";
  local_628 = &boost::unit_test::basic_cstring<char_const>::null;
  local_620 = &boost::unit_test::basic_cstring<char_const>::null;
  _cVar11 = 0x2d4508;
  file_04.m_end = (iterator)0x132;
  file_04.m_begin = (iterator)&local_618;
  msg_04.m_end = pvVar7;
  msg_04.m_begin = pvVar6;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_628,
             msg_04);
  local_458._0_8_ = CONCAT71(local_458._1_7_,mutated) ^ 1;
  local_458.m_message.px = (element_type *)0x0;
  local_458.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_5e8._0_8_ = "!mutated";
  local_5e8._8_8_ = "";
  local_438.m_message.px = (element_type *)((ulong)local_438.m_message.px & 0xffffffffffffff00);
  local_438._0_8_ = &PTR__lazy_ostream_013ae1c8;
  local_438.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_638 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/blockencodings_tests.cpp"
  ;
  local_630 = "";
  local_420 = (lazy_ostream *)local_5e8;
  boost::test_tools::tt_detail::report_assertion
            (&local_458,(lazy_ostream *)&local_438,1,0,WARN,_cVar11,(size_t)&local_638,0x132);
  boost::detail::shared_count::~shared_count(&local_458.m_message.pn);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&vtx_missing);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)local_348);
  if (local_290 != (_Manager_type)0x0) {
    (*local_290)(&local_2a0,&local_2a0,__destroy_functor);
  }
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             *)&ret);
  std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::~vector
            (&shortIDs2.prefilledtxn);
  if (shortIDs2.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(shortIDs2.shorttxids.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)shortIDs2.shorttxids.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)shortIDs2.shorttxids.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>::~_Vector_base
            ((_Vector_base<std::byte,_zero_after_free_allocator<std::byte>_> *)&local_4f8);
  std::vector<PrefilledTransaction,_std::allocator<PrefilledTransaction>_>::~vector
            (&shortIDs.prefilledtxn);
  if (shortIDs.shorttxids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(shortIDs.shorttxids.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)shortIDs.shorttxids.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)shortIDs.shorttxids.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  ChaCha20::~ChaCha20(&rand_ctx.rng);
  std::
  vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
  ::~vector(&local_a8.vtx);
  std::vector<CTxOut,_std::allocator<CTxOut>_>::~vector(&coinbase.vout);
  std::vector<CTxIn,_std::allocator<CTxIn>_>::~vector(&coinbase.vin);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(EmptyBlockRoundTripTest)
{
    CTxMemPool& pool = *Assert(m_node.mempool);
    CMutableTransaction coinbase = BuildTransactionTestCase();

    CBlock block;
    auto rand_ctx(FastRandomContext(uint256{42}));
    block.vtx.resize(1);
    block.vtx[0] = MakeTransactionRef(std::move(coinbase));
    block.nVersion = 42;
    block.hashPrevBlock = rand_ctx.rand256();
    block.nBits = 0x207fffff;

    bool mutated;
    block.hashMerkleRoot = BlockMerkleRoot(block, &mutated);
    assert(!mutated);
    while (!CheckProofOfWork(block.GetHash(), block.nBits, Params().GetConsensus())) ++block.nNonce;

    // Test simple header round-trip with only coinbase
    {
        CBlockHeaderAndShortTxIDs shortIDs{block, rand_ctx.rand64()};

        DataStream stream{};
        stream << shortIDs;

        CBlockHeaderAndShortTxIDs shortIDs2;
        stream >> shortIDs2;

        PartiallyDownloadedBlock partialBlock(&pool);
        BOOST_CHECK(partialBlock.InitData(shortIDs2, empty_extra_txn) == READ_STATUS_OK);
        BOOST_CHECK(partialBlock.IsTxAvailable(0));

        CBlock block2;
        std::vector<CTransactionRef> vtx_missing;
        BOOST_CHECK(partialBlock.FillBlock(block2, vtx_missing) == READ_STATUS_OK);
        BOOST_CHECK_EQUAL(block.GetHash().ToString(), block2.GetHash().ToString());
        BOOST_CHECK_EQUAL(block.hashMerkleRoot.ToString(), BlockMerkleRoot(block2, &mutated).ToString());
        BOOST_CHECK(!mutated);
    }
}